

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper-a64.c
# Opt level: O0

uint32_t helper_advsimd_muladd2h_aarch64(uint32_t two_a,uint32_t two_b,uint32_t two_c,void *fpstp)

{
  float16 fVar1;
  float16 fVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t r2;
  uint32_t r1;
  float16 c2;
  float16 c1;
  float16 b2;
  float16 b1;
  float16 a2;
  float16 a1;
  float_status *fpst;
  void *fpstp_local;
  uint32_t two_c_local;
  uint32_t two_b_local;
  uint32_t two_a_local;
  
  uVar3 = extract32(two_a,0,0x10);
  uVar4 = extract32(two_a,0x10,0x10);
  uVar5 = extract32(two_b,0,0x10);
  uVar6 = extract32(two_b,0x10,0x10);
  uVar7 = extract32(two_c,0,0x10);
  uVar8 = extract32(two_c,0x10,0x10);
  fVar1 = float16_muladd_aarch64
                    ((float16)uVar3,(float16)uVar5,(float16)uVar7,0,(float_status *)fpstp);
  fVar2 = float16_muladd_aarch64
                    ((float16)uVar4,(float16)uVar6,(float16)uVar8,0,(float_status *)fpstp);
  uVar3 = deposit32((uint)fVar1,0x10,0x10,(uint)fVar2);
  return uVar3;
}

Assistant:

uint32_t HELPER(advsimd_muladd2h)(uint32_t two_a, uint32_t two_b,
                                  uint32_t two_c, void *fpstp)
{
    float_status *fpst = fpstp;
    float16  a1, a2, b1, b2, c1, c2;
    uint32_t r1, r2;
    a1 = extract32(two_a, 0, 16);
    a2 = extract32(two_a, 16, 16);
    b1 = extract32(two_b, 0, 16);
    b2 = extract32(two_b, 16, 16);
    c1 = extract32(two_c, 0, 16);
    c2 = extract32(two_c, 16, 16);
    r1 = float16_muladd(a1, b1, c1, 0, fpst);
    r2 = float16_muladd(a2, b2, c2, 0, fpst);
    return deposit32(r1, 16, 16, r2);
}